

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  int iVar2;
  uint uVar3;
  GLFWbool GVar4;
  _GLFWfbconfig *p_Var5;
  uintptr_t *in_RDX;
  _GLFWfbconfig *in_RSI;
  int *in_RDI;
  XVisualInfo *vis;
  int count;
  XVisualInfo vi;
  _GLFWfbconfig *u;
  EGLConfig n;
  int usableCount;
  int nativeCount;
  int i;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  EGLConfig *nativeConfigs;
  long in_stack_ffffffffffffff58;
  EGLConfig in_stack_ffffffffffffff60;
  Visual *in_stack_ffffffffffffff68;
  uint local_44;
  int local_40;
  int local_3c;
  _GLFWfbconfig *local_38;
  _GLFWfbconfig *local_30;
  EGLConfig *local_28;
  uintptr_t *local_20;
  _GLFWfbconfig *local_18;
  int *local_10;
  uint local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_40);
  if (local_40 == 0) {
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
    local_4 = 0;
  }
  else {
    local_28 = (EGLConfig *)calloc((long)local_40,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,local_28,local_40,&local_40);
    local_30 = (_GLFWfbconfig *)calloc((long)local_40,0x48);
    local_44 = 0;
    for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
      pvVar1 = local_28[local_3c];
      p_Var5 = local_30 + (int)local_44;
      iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      if ((iVar2 == 0x308e) &&
         (uVar3 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20)),
         (uVar3 & 4) != 0)) {
        memset(&stack0xffffffffffffff68,0,0x40);
        iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                   (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        if (iVar2 != 0) {
          if ((local_18->transparent != 0) &&
             (in_stack_ffffffffffffff58 =
                   XGetVisualInfo(_glfw.x11.display,1,&stack0xffffffffffffff68,
                                  &stack0xffffffffffffff64), in_stack_ffffffffffffff58 != 0)) {
            GVar4 = _glfwIsVisualTransparentX11(in_stack_ffffffffffffff68);
            p_Var5->transparent = GVar4;
            XFree(in_stack_ffffffffffffff58);
          }
          iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
          if (*local_10 == 0x30002) {
            if (local_10[2] == 1) {
              uVar3 = getEGLConfigAttrib(in_stack_ffffffffffffff60,iVar2);
              uVar3 = uVar3 & 1;
            }
            else {
              uVar3 = getEGLConfigAttrib(in_stack_ffffffffffffff60,iVar2);
              uVar3 = uVar3 & 4;
            }
joined_r0x003bc0ce:
            if (uVar3 == 0) goto LAB_003bc1b3;
          }
          else if (*local_10 == 0x30001) {
            uVar3 = getEGLConfigAttrib(in_stack_ffffffffffffff60,iVar2);
            uVar3 = uVar3 & 8;
            goto joined_r0x003bc0ce;
          }
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->redBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->greenBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->blueBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->alphaBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->depthBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->stencilBits = iVar2;
          iVar2 = getEGLConfigAttrib(in_stack_ffffffffffffff60,
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          p_Var5->samples = iVar2;
          p_Var5->doublebuffer = local_18->doublebuffer;
          p_Var5->handle = (uintptr_t)pvVar1;
          local_44 = local_44 + 1;
        }
      }
LAB_003bc1b3:
    }
    local_38 = _glfwChooseFBConfig(local_18,local_30,local_44);
    if (local_38 != (_GLFWfbconfig *)0x0) {
      *local_20 = local_38->handle;
    }
    free(local_28);
    free(local_30);
    local_4 = (uint)(local_38 != (_GLFWfbconfig *)0x0);
  }
  return local_4;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        {
            XVisualInfo vi = {0};

            // Only consider EGLConfigs with associated Visuals
            vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
            if (!vi.visualid)
                continue;

            if (desired->transparent)
            {
                int count;
                XVisualInfo* vis =
                    XGetVisualInfo(_glfw.x11.display, VisualIDMask, &vi, &count);
                if (vis)
                {
                    u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                    XFree(vis);
                }
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = desired->doublebuffer;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}